

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall mock_buffer<int>::mock_buffer(mock_buffer<int> *this,int *data)

{
  int *in_RSI;
  basic_buffer<int> *in_RDI;
  FunctionMocker<void_(unsigned_long)> *in_stack_ffffffffffffffe0;
  
  fmt::v5::internal::basic_buffer<int>::basic_buffer(in_RDI,(int *)0x0,0,0);
  in_RDI->_vptr_basic_buffer = (_func_int **)&PTR_grow_00264800;
  testing::internal::FunctionMocker<void_(unsigned_long)>::FunctionMocker(in_stack_ffffffffffffffe0)
  ;
  fmt::v5::internal::basic_buffer<int>::set(in_RDI,in_RSI,0);
  return;
}

Assistant:

mock_buffer(T *data) { this->set(data, 0); }